

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::
basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
::basic_command(basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *footer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *footer_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header_local;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)header);
  std::__cxx11::string::string((string *)&this->m_footer,(string *)footer);
  return;
}

Assistant:

explicit basic_command(String const &header, String const &footer = String()) :
        m_header(header), m_footer(footer)
    {}